

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

ulongi checksum(AD *ad)

{
  AD *ad_local;
  
  return (ulongi)(ad->client_space + ad->nbytes + ad->datatype + ad->nelem);
}

Assistant:

private ulongi checksum(ad)
    AD        *ad;        /* the AD to compute checksum for */
{
    return (ulongi)(
                ad->datatype +
                ad->nelem +
        (ulongi)ad->client_space +
                ad->nbytes);
}